

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_main.c
# Opt level: O0

void main_checkfds(void)

{
  int iVar1;
  bool bVar2;
  int local_10;
  int local_c;
  int fd [2];
  
  memset(&local_10,0,8);
  while( true ) {
    bVar2 = true;
    if ((((local_10 != 0) && (bVar2 = true, local_10 != 1)) && (bVar2 = true, local_10 != 2)) &&
       ((bVar2 = true, local_c != 0 && (bVar2 = true, local_c != 1)))) {
      bVar2 = local_c == 2;
    }
    if (!bVar2) break;
    iVar1 = pipe(&local_10);
    if (iVar1 < 0) {
      return;
    }
  }
  close(local_10);
  close(local_c);
  return;
}

Assistant:

static void main_checkfds(void)
{
#ifdef HAVE_PIPE
  int fd[2] = { STDIN_FILENO, STDIN_FILENO };
  while(fd[0] == STDIN_FILENO ||
        fd[0] == STDOUT_FILENO ||
        fd[0] == STDERR_FILENO ||
        fd[1] == STDIN_FILENO ||
        fd[1] == STDOUT_FILENO ||
        fd[1] == STDERR_FILENO)
    if(pipe(fd) < 0)
      return;   /* Out of handles. This isn't really a big problem now, but
                   will be when we try to create a socket later. */
  close(fd[0]);
  close(fd[1]);
#endif
}